

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process_Unix::Duplicate(Process_Unix *this)

{
  int iVar1;
  ILogger *pIVar2;
  char *pcVar3;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Process_Unix *pPStack_18;
  int status;
  Process_Unix *this_local;
  
  pPStack_18 = this;
  local_1c = posix_spawn_file_actions_adddup2
                       ((posix_spawn_file_actions_t *)&this->child_fd_actions,this->pipe_stdout[1],1
                       );
  if (local_1c == 0) {
    local_1c = posix_spawn_file_actions_adddup2
                         ((posix_spawn_file_actions_t *)&this->child_fd_actions,this->pipe_stderr[1]
                          ,2);
    if (local_1c == 0) {
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Process_Unix",&local_79);
      pIVar2 = gnilk::Logger::GetLogger(&local_78);
      iVar1 = local_1c;
      pcVar3 = strerror(local_1c);
      gnilk::Log::Error<char_const*,int,char*>
                (pIVar2,"posix_spawn_file_actions_adddup2 %d, %s",iVar1,pcVar3);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Process_Unix",&local_41)
    ;
    pIVar2 = gnilk::Logger::GetLogger(&local_40);
    iVar1 = local_1c;
    pcVar3 = strerror(local_1c);
    gnilk::Log::Error<char_const*,int,char*>
              (pIVar2,"posix_spawn_file_actions_adddup2 %d, %s",iVar1,pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Process_Unix::Duplicate() {
	int status;
	// stdout
	status = posix_spawn_file_actions_adddup2(&child_fd_actions, pipe_stdout[1], 1);
	if (status) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_adddup2 %d, %s", status, strerror(status));
		return false;
	}
	// stderr
	status = posix_spawn_file_actions_adddup2(&child_fd_actions, pipe_stderr[1], 2);
	if (status) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_adddup2 %d, %s", status, strerror(status));
		return false;					
	}
	return true;
}